

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

bool __thiscall
Rml::DataModel::BindEventCallback(DataModel *this,String *name,DataEventFunc *event_func)

{
  bool bVar1;
  undefined8 uVar2;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  local_50;
  byte local_31;
  char *pcStack_30;
  bool inserted;
  char *name_error_str;
  DataEventFunc *event_func_local;
  String *name_local;
  DataModel *this_local;
  
  name_error_str = (char *)event_func;
  event_func_local = (DataEventFunc *)name;
  name_local = (String *)this;
  pcStack_30 = LegalVariableName(name);
  if (pcStack_30 == (char *)0x0) {
    bVar1 = ::std::function::operator_cast_to_bool((function *)event_func);
    if (bVar1) {
      robin_hood::detail::
      Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
      ::
      emplace<std::__cxx11::string_const&,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>>
                (&local_50,
                 (Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                  *)&this->event_callbacks,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 event_func_local,event_func);
      local_31 = local_50.second & 1;
      if (local_31 == 0) {
        uVar2 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Data event callback with name \'%s\' already exists.",uVar2);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      uVar2 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,
                   "Could not bind data event callback \'%s\' to data model, empty function provided."
                   ,uVar2);
      this_local._7_1_ = false;
    }
  }
  else {
    uVar2 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"Could not bind data event callback \'%s\'. %s",uVar2,pcStack_30);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DataModel::BindEventCallback(const String& name, DataEventFunc event_func)
{
	const char* name_error_str = LegalVariableName(name);
	if (name_error_str)
	{
		Log::Message(Log::LT_WARNING, "Could not bind data event callback '%s'. %s", name.c_str(), name_error_str);
		return false;
	}

	if (!event_func)
	{
		Log::Message(Log::LT_WARNING, "Could not bind data event callback '%s' to data model, empty function provided.", name.c_str());
		return false;
	}

	bool inserted = event_callbacks.emplace(name, std::move(event_func)).second;
	if (!inserted)
	{
		Log::Message(Log::LT_WARNING, "Data event callback with name '%s' already exists.", name.c_str());
		return false;
	}

	return true;
}